

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer_sink.h
# Opt level: O2

void __thiscall
spdlog::sinks::ringbuffer_sink<std::mutex>::ringbuffer_sink
          (ringbuffer_sink<std::mutex> *this,size_t n_items)

{
  base_sink<std::mutex>::base_sink(&this->super_base_sink<std::mutex>);
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__ringbuffer_sink_0031f648;
  details::circular_q<spdlog::details::log_msg_buffer>::circular_q(&this->q_,n_items);
  return;
}

Assistant:

explicit ringbuffer_sink(size_t n_items)
        : q_{n_items}
    {}